

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O3

int rhsQ(sunrealtype t,N_Vector yy,N_Vector yp,N_Vector qdot,void *user_data)

{
  double *pdVar1;
  
  pdVar1 = *(double **)((long)yy->content + 0x10);
  **(double **)((long)qdot->content + 0x10) =
       (pdVar1[2] * pdVar1[2] + *pdVar1 * *pdVar1 + pdVar1[1] * pdVar1[1]) * 0.5;
  return 0;
}

Assistant:

static int rhsQ(sunrealtype t, N_Vector yy, N_Vector yp, N_Vector qdot,
                void* user_data)
{
  sunrealtype y1, y2, y3;

  y1           = Ith(yy, 1);
  y2           = Ith(yy, 2);
  y3           = Ith(yy, 3);
  Ith(qdot, 1) = HALF * (y1 * y1 + y2 * y2 + y3 * y3);

  return (0);
}